

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamData(QNetworkReplyImplPrivate *this,QByteDataBuffer *data)

{
  char cVar1;
  QByteArray *qba;
  long lVar2;
  char *pcVar3;
  qsizetype i;
  ulong i_00;
  
  cVar1 = QIODevice::isOpen();
  if (cVar1 != '\0') {
    if ((this->cacheEnabled == true) && (this->cacheSaveDevice == (QIODevice *)0x0)) {
      initCacheSaveDevice(this);
    }
    lVar2 = 0;
    for (i_00 = 0; i_00 < (ulong)(data->buffers).d.size; i_00 = i_00 + 1) {
      qba = QByteDataBuffer::operator[](data,i_00);
      if (this->cacheSaveDevice != (QIODevice *)0x0) {
        pcVar3 = (qba->d).ptr;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = (char *)&QByteArray::_empty;
        }
        QIODevice::write((char *)this->cacheSaveDevice,(longlong)pcVar3);
      }
      QIODevicePrivate::QRingBufferRef::append
                ((QRingBufferRef *)&(this->super_QNetworkReplyPrivate).field_0x90,qba);
      lVar2 = lVar2 + (qba->d).size;
    }
    QByteDataBuffer::clear(data);
    this->bytesDownloaded = this->bytesDownloaded + lVar2;
    appendDownstreamDataSignalEmissions(this);
    return;
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamData(QByteDataBuffer &data)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    if (cacheEnabled && !cacheSaveDevice) {
        initCacheSaveDevice();
    }

    qint64 bytesWritten = 0;
    for (qsizetype i = 0; i < data.bufferCount(); ++i) {
        QByteArray const &item = data[i];

        if (cacheSaveDevice)
            cacheSaveDevice->write(item.constData(), item.size());
        buffer.append(item);

        bytesWritten += item.size();
    }
    data.clear();

    bytesDownloaded += bytesWritten;

    appendDownstreamDataSignalEmissions();
}